

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_val_t *
gs_eval_cast(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t val,gs_val_type type)

{
  undefined8 uVar1;
  
  if (val.type == type) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = val.field_2._8_8_;
    uVar1 = val._0_8_;
    __return_storage_ptr__->type = (int)uVar1;
    __return_storage_ptr__->is_return = (_Bool)(char)((ulong)uVar1 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x5 = (int3)((ulong)uVar1 >> 0x28);
    (__return_storage_ptr__->field_2).vec2_val = val.field_2._0_8_;
  }
  else if (type == GS_VAL_FLOAT && val.type == GS_VAL_INT) {
    __return_storage_ptr__->type = GS_VAL_FLOAT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).float_val = (float)val.field_2.int_val;
  }
  else if (type == GS_VAL_INT && val.type == GS_VAL_FLOAT) {
    __return_storage_ptr__->type = GS_VAL_INT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = (int)val.field_2.float_val;
  }
  else {
    gs_val_error(__return_storage_ptr__,"Unable to perform cast");
  }
  return __return_storage_ptr__;
}

Assistant:

gs_val_t gs_eval_cast(gs_eval_t *eval, gs_val_t val, gs_val_type type) {
    GOLF_UNUSED(eval);

    if (val.type == type) {
        return val;
    }

    if (val.type == GS_VAL_INT && type == GS_VAL_FLOAT) {
        return gs_val_float((float)val.int_val);
    }
    else if (val.type == GS_VAL_FLOAT && type == GS_VAL_INT) {
        return gs_val_int((int)val.float_val);
    }

    return gs_val_error("Unable to perform cast");
}